

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O2

void google::protobuf::internal::InitShutdownFunctions(void)

{
  Mutex *this;
  
  shutdown_functions = (undefined8 *)operator_new(0x18);
  *shutdown_functions = 0;
  shutdown_functions[1] = 0;
  shutdown_functions[2] = 0;
  this = (Mutex *)operator_new(8);
  Mutex::Mutex(this);
  shutdown_functions_mutex = this;
  return;
}

Assistant:

void InitShutdownFunctions() {
  shutdown_functions = new vector<void (*)()>;
  shutdown_functions_mutex = new Mutex;
}